

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_uint16_linear_scaled_BGRA(void *outputp,int width_times_channels,float *encode)

{
  short *psVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  float *pfVar4;
  short *psVar5;
  short *psVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar2 = _DAT_00619ae0;
  psVar1 = (short *)((long)outputp + (long)width_times_channels * 2);
  fVar7 = (float)DAT_00619ae0;
  fVar8 = DAT_00619ae0._4_4_;
  fVar9 = DAT_00619ae0._8_4_;
  fVar10 = DAT_00619ae0._12_4_;
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      psVar5 = (short *)((long)outputp + 8);
      do {
        auVar12._0_4_ = encode[2] * fVar9 + 0.5;
        auVar12._4_4_ = encode[1] * fVar8 + 0.5;
        auVar12._8_4_ = *encode * fVar7 + 0.5;
        auVar12._12_4_ = encode[3] * fVar10 + 0.5;
        auVar12 = minps(auVar12,auVar2);
        auVar12 = maxps(auVar12,ZEXT816(0));
        auVar22._0_4_ = (int)auVar12._0_4_ - (int)stbir__s32_32768[0];
        auVar22._4_4_ = (int)auVar12._4_4_ - stbir__s32_32768[0]._4_4_;
        auVar22._8_4_ = (int)auVar12._8_4_ - (int)stbir__s32_32768[1];
        auVar22._12_4_ = (int)auVar12._12_4_ - stbir__s32_32768[1]._4_4_;
        auVar12 = packssdw(auVar22,auVar22);
        *(ulong *)(psVar5 + -4) =
             CONCAT26(auVar12._6_2_ - stbir__s16_32768[0]._6_2_,
                      CONCAT24(auVar12._4_2_ - stbir__s16_32768[0]._4_2_,
                               CONCAT22(auVar12._2_2_ - stbir__s16_32768[0]._2_2_,
                                        auVar12._0_2_ - (short)stbir__s16_32768[0])));
        encode = encode + 4;
        psVar5 = psVar5 + 4;
      } while (psVar5 <= psVar1);
    }
  }
  else {
    pfVar3 = encode;
    do {
      psVar5 = (short *)((long)outputp + 0x10);
      psVar6 = psVar1 + -8;
      if (psVar5 == psVar1) {
        psVar6 = psVar5;
      }
      pfVar4 = encode + (long)width_times_channels + -8;
      if (psVar5 == psVar1) {
        pfVar4 = pfVar3 + 8;
      }
      if (psVar5 <= psVar1 + -8) {
        pfVar4 = pfVar3 + 8;
        psVar6 = psVar5;
      }
      auVar11._0_4_ = pfVar3[2] * fVar9 + 0.5;
      auVar11._4_4_ = pfVar3[1] * fVar8 + 0.5;
      auVar11._8_4_ = *pfVar3 * fVar7 + 0.5;
      auVar11._12_4_ = pfVar3[3] * fVar10 + 0.5;
      auVar21._0_4_ = pfVar3[6] * fVar9 + 0.5;
      auVar21._4_4_ = pfVar3[5] * fVar8 + 0.5;
      auVar21._8_4_ = pfVar3[4] * fVar7 + 0.5;
      auVar21._12_4_ = pfVar3[7] * fVar10 + 0.5;
      auVar12 = minps(auVar11,auVar2);
      auVar12 = maxps(auVar12,ZEXT816(0));
      auVar22 = minps(auVar21,auVar2);
      auVar22 = maxps(auVar22,ZEXT816(0));
      auVar13._0_4_ = (int)auVar12._0_4_ - (int)stbir__s32_32768[0];
      auVar13._4_4_ = (int)auVar12._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar13._8_4_ = (int)auVar12._8_4_ - (int)stbir__s32_32768[1];
      auVar13._12_4_ = (int)auVar12._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar23._0_4_ = (int)auVar22._0_4_ - (int)stbir__s32_32768[0];
      auVar23._4_4_ = (int)auVar22._4_4_ - stbir__s32_32768[0]._4_4_;
      auVar23._8_4_ = (int)auVar22._8_4_ - (int)stbir__s32_32768[1];
      auVar23._12_4_ = (int)auVar22._12_4_ - stbir__s32_32768[1]._4_4_;
      auVar12 = packssdw(auVar13,auVar23);
      sVar14 = auVar12._2_2_ - stbir__s16_32768[0]._2_2_;
      sVar15 = auVar12._4_2_ - stbir__s16_32768[0]._4_2_;
      sVar16 = auVar12._6_2_ - stbir__s16_32768[0]._6_2_;
      sVar17 = auVar12._8_2_ - (short)stbir__s16_32768[1];
      sVar18 = auVar12._10_2_ - stbir__s16_32768[1]._2_2_;
      sVar19 = auVar12._12_2_ - stbir__s16_32768[1]._4_2_;
      sVar20 = auVar12._14_2_ - stbir__s16_32768[1]._6_2_;
      *(short *)outputp = auVar12._0_2_ - (short)stbir__s16_32768[0];
      *(short *)((long)outputp + 2) = sVar14;
      *(short *)((long)outputp + 4) = sVar15;
      *(short *)((long)outputp + 6) = sVar16;
      *(short *)((long)outputp + 8) = sVar17;
      *(short *)((long)outputp + 10) = sVar18;
      *(short *)((long)outputp + 0xc) = sVar19;
      *(short *)((long)outputp + 0xe) = sVar20;
      pfVar3 = pfVar4;
      outputp = psVar6;
    } while (psVar5 != psVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__encode_uint16_linear_scaled)( void * outputp, int width_times_channels, float const * encode )
{
  unsigned short STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned short*) outputp;
  unsigned short * end_output = ( (unsigned short*) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  {
    if ( width_times_channels >= stbir__simdfX_float_count*2 )
    {
      float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
      end_output -= stbir__simdfX_float_count*2;
      STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
      for(;;)
      {
        stbir__simdfX e0, e1;
        stbir__simdiX i;
        STBIR_SIMD_NO_UNROLL(encode);
        stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode );
        stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint16_as_floatX, encode+stbir__simdfX_float_count );
        stbir__encode_simdfX_unflip( e0 );
        stbir__encode_simdfX_unflip( e1 );
        stbir__simdfX_pack_to_words( i, e0, e1 );
        stbir__simdiX_store( output, i );
        encode += stbir__simdfX_float_count*2;
        output += stbir__simdfX_float_count*2;
        if ( output <= end_output )
          continue;
        if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
          break;
        output = end_output;     // backup and do last couple
        encode = end_encode_m8;
      }
      return;
    }
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e;
    stbir__simdi i;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e, encode );
    stbir__simdf_madd( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), e );
    stbir__encode_simdf4_unflip( e );
    stbir__simdf_pack_to_8words( i, e, e );  // only use first 4
    stbir__simdi_store2( output-4, i );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_short( e );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_short( e );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint16_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_short( e );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0-4] = (unsigned short)f;
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1-4] = (unsigned short)f;
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2-4] = (unsigned short)f;
    f = encode[stbir__encode_order3] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[3-4] = (unsigned short)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[0] = (unsigned short)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[1] = (unsigned short)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint16_as_float + 0.5f; STBIR_CLAMP(f, 0, 65535); output[2] = (unsigned short)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}